

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::setRoot
          (const_iterator *this,uint32_t offset)

{
  uint32_t uStack_10;
  uint32_t uStack_c;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIStack_8;
  
  pIStack_8 = this->map;
  uStack_c = pIStack_8->rootSize;
  if (pIStack_8->height == 0) {
    IntervalMapDetails::Path::
    setRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>>
              (&this->path,(LeafNode<unsigned_long,_std::monostate,_11U,_true> *)pIStack_8,uStack_c,
               offset);
    return;
  }
  (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  uStack_10 = offset;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
  emplace_back<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>*&,unsigned_int&,unsigned_int&>
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
             (BranchNode<unsigned_long,_8U,_true> **)&pIStack_8,&uStack_c,&uStack_10);
  return;
}

Assistant:

void setRoot(uint32_t offset) {
        if (isFlat())
            path.setRoot(&map->rootLeaf, map->rootSize, offset);
        else
            path.setRoot(&map->rootBranch, map->rootSize, offset);
    }